

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  ComplexFactory *this;
  SimpleFactory *this_00;
  string *psVar2;
  char *__assertion;
  string name;
  string local_30 [32];
  
  this = (ComplexFactory *)operator_new(8);
  (this->super_AbstractFactory)._vptr_AbstractFactory =
       (_func_int **)&PTR_createCurvedInstance_00103d68;
  this_00 = (SimpleFactory *)operator_new(8);
  (this_00->super_AbstractFactory)._vptr_AbstractFactory =
       (_func_int **)&PTR_createCurvedInstance_00103da8;
  psVar2 = (string *)SimpleFactory::createCurvedInstance(this_00);
  std::__cxx11::string::string((string *)&name,psVar2);
  bVar1 = std::operator==(&name,"circle");
  if (bVar1) {
    psVar2 = (string *)ComplexFactory::createCurvedInstance(this);
    std::__cxx11::string::string(local_30,psVar2);
    std::__cxx11::string::operator=((string *)&name,local_30);
    std::__cxx11::string::~string(local_30);
    bVar1 = std::operator==(&name,"ellipse");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&name);
      return 0;
    }
    __assertion = "name == \"ellipse\"";
    __line = 0x11;
  }
  else {
    __assertion = "name == \"circle\"";
    __line = 0xd;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  AbstractFactory *complexFactry = new ComplexFactory;
  AbstractFactory *simpleFactry = new SimpleFactory;

  Shape *simpleShape = simpleFactry->createCurvedInstance();
  std::string name = simpleShape->getValue();
  assert(name == "circle");

  Shape *complexShape = complexFactry->createCurvedInstance();
  name = complexShape->getValue();
  assert(name == "ellipse");
}